

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_8.cpp
# Opt level: O2

void printIntro(void)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Welcome to Bulls and Cows game!\n");
  poVar1 = std::operator<<(poVar1,"Try to guess a 4 letter word.\n");
  poVar1 = std::operator<<(poVar1,"For example, \'milk\' is a word that you need to guess.\n");
  poVar1 = std::operator<<(poVar1,
                           "Let \'meal\' will be your first guess. For that guess you will get\n");
  poVar1 = std::operator<<(poVar1,"1 bull for guessing right the position and letter (1),\n");
  poVar1 = std::operator<<(poVar1,"and 1 cow for guessing wrong the position, but guessing right\n")
  ;
  poVar1 = std::operator<<(poVar1,"the letter (4).\n");
  poVar1 = std::operator<<(poVar1,"You can guess 15 times.\n");
  std::operator<<(poVar1,"Good luck!\n");
  return;
}

Assistant:

void printIntro()
{
	std::cout << "Welcome to Bulls and Cows game!\n"
			  << "Try to guess a 4 letter word.\n"
			  << "For example, 'milk' is a word that you need to guess.\n"
			  << "Let 'meal' will be your first guess. For that guess you will get\n"
			  << "1 bull for guessing right the position and letter (1),\n"
			  << "and 1 cow for guessing wrong the position, but guessing right\n"
			  << "the letter (4).\n"
			  << "You can guess 15 times.\n"
			  << "Good luck!\n";
}